

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall
cmOrderDirectoriesConstraintSOName::Report(cmOrderDirectoriesConstraintSOName *this,ostream *e)

{
  ulong uVar1;
  ostream *e_local;
  cmOrderDirectoriesConstraintSOName *this_local;
  
  std::operator<<(e,"runtime library [");
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator<<(e,(string *)&this->SOName);
  }
  else {
    std::operator<<(e,(string *)&(this->super_cmOrderDirectoriesConstraint).FileName);
  }
  std::operator<<(e,"]");
  return;
}

Assistant:

void Report(std::ostream& e) CM_OVERRIDE
  {
    e << "runtime library [";
    if (this->SOName.empty()) {
      e << this->FileName;
    } else {
      e << this->SOName;
    }
    e << "]";
  }